

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  int iVar1;
  void *ndata;
  secp256k1_nonce_function_hardened noncefp;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/schnorrsig/main_impl.h"
            ,0xcf,"test condition failed: ctx != NULL");
    abort();
  }
  if (extraparams == (secp256k1_schnorrsig_extraparams *)0x0) {
    noncefp = (secp256k1_nonce_function_hardened)0x0;
    ndata = (void *)0x0;
  }
  else {
    iVar1 = secp256k1_memcmp_var(extraparams,schnorrsig_extraparams_magic,4);
    if (iVar1 != 0) {
      (*(ctx->illegal_callback).fn)
                ("secp256k1_memcmp_var(extraparams->magic, schnorrsig_extraparams_magic, sizeof(extraparams->magic)) == 0"
                 ,(ctx->illegal_callback).data);
      return 0;
    }
    noncefp = extraparams->noncefp;
    ndata = extraparams->ndata;
  }
  iVar1 = secp256k1_schnorrsig_sign_internal(ctx,sig64,msg,msglen,keypair,noncefp,ndata);
  return iVar1;
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}